

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::ClusterList::intersect(ClusterList *this,BoxArray *domba)

{
  bool bVar1;
  uint uVar2;
  reference ppCVar3;
  Box *this_00;
  Long LVar4;
  int __fdout;
  _List_node_base *in_RSI;
  list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  ClusterList clst;
  BoxDomain bxdom;
  bool assume_disjoint_ba;
  Cluster *c;
  iterator cli;
  BoxDomain dom;
  BoxArray *in_stack_00000128;
  uint __flags;
  Cluster *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  const_iterator __position;
  _Self in_stack_ffffffffffffff20;
  _List_const_iterator<amrex::Cluster_*> in_stack_ffffffffffffff28;
  iterator in_stack_ffffffffffffff30;
  _List_const_iterator<amrex::Cluster_*> local_c8;
  BoxArray *in_stack_ffffffffffffff40;
  IntVect local_88;
  byte local_79;
  Cluster *local_78;
  _Self local_70;
  _Self local_68 [6];
  IntVect *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd7;
  Box *in_stack_ffffffffffffffd8;
  BoxArray *in_stack_ffffffffffffffe0;
  
  BoxArray::removeOverlap(in_stack_00000128,this._7_1_);
  BoxArray::boxList((BoxArray *)
                    clst.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
                    _M_impl._M_node._M_size);
  BoxDomain::BoxDomain
            ((BoxDomain *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (BoxList *)in_stack_fffffffffffffed8);
  BoxList::~BoxList((BoxList *)0x18e1941);
  local_68[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::begin
                 ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                  in_stack_fffffffffffffed8);
  while( true ) {
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::end
                   ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                    in_stack_fffffffffffffed8);
    bVar1 = std::operator!=(local_68,&local_70);
    if (!bVar1) break;
    ppCVar3 = std::_List_iterator<amrex::Cluster_*>::operator*
                        ((_List_iterator<amrex::Cluster_*> *)0x18e1990);
    local_78 = *ppCVar3;
    local_79 = 1;
    __position._M_node = in_RSI;
    this_00 = Cluster::box(local_78);
    uVar2 = (uint)local_79;
    IntVect::IntVect(&local_88,0);
    __fdout = (int)&local_88;
    bVar1 = BoxArray::contains(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                               (bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8);
    if (bVar1) {
      std::_List_iterator<amrex::Cluster_*>::operator++(local_68);
    }
    else {
      BoxDomain::BoxDomain((BoxDomain *)__position._M_node);
      Cluster::box(local_78);
      amrex::intersect((BoxDomain *)CONCAT44(uVar2,in_stack_fffffffffffffee0),
                       (BoxDomain *)in_stack_fffffffffffffed8,(Box *)0x18e1a92);
      LVar4 = BoxList::size((BoxList *)0x18e1aa1);
      if (0 < LVar4) {
        ClusterList((ClusterList *)CONCAT44(uVar2,in_stack_fffffffffffffee0));
        Cluster::distribute((Cluster *)in_stack_ffffffffffffff30._M_node,
                            (ClusterList *)in_stack_ffffffffffffff28._M_node,
                            (BoxDomain *)in_stack_ffffffffffffff20._M_node);
        in_stack_ffffffffffffff30 =
             std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::end
                       ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                        in_stack_fffffffffffffed8);
        __flags = (uint)in_stack_fffffffffffffed8;
        std::_List_const_iterator<amrex::Cluster_*>::_List_const_iterator
                  (&local_c8,(iterator *)&stack0xffffffffffffff30);
        std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::splice
                  (in_RDI,(int)local_c8._M_node,(__off64_t *)&stack0xffffffffffffff40,__fdout,in_R8,
                   in_R9,__flags);
        ~ClusterList((ClusterList *)this_00);
      }
      in_stack_fffffffffffffed8 = local_78;
      if (local_78 != (Cluster *)0x0) {
        Cluster::~Cluster(local_78);
        operator_delete(in_stack_fffffffffffffed8,0x30);
      }
      in_stack_ffffffffffffff20 = std::_List_iterator<amrex::Cluster_*>::operator++(local_68,0);
      std::_List_const_iterator<amrex::Cluster_*>::_List_const_iterator
                ((_List_const_iterator<amrex::Cluster_*> *)&stack0xffffffffffffff28,
                 (iterator *)&stack0xffffffffffffff20);
      std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::erase
                ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)
                 CONCAT44(uVar2,in_stack_fffffffffffffee0),__position);
      BoxDomain::~BoxDomain((BoxDomain *)0x18e1bb7);
    }
  }
  BoxArray::clear(in_stack_ffffffffffffff40);
  BoxDomain::~BoxDomain((BoxDomain *)0x18e1be9);
  return;
}

Assistant:

void
ClusterList::intersect (BoxArray& domba)
{
    BL_PROFILE("ClusterList::intersect()");

    domba.removeOverlap();

    BoxDomain dom(domba.boxList());

    for (std::list<Cluster*>::iterator cli = lst.begin(); cli != lst.end(); )
    {
        Cluster* c = *cli;

        bool assume_disjoint_ba = true;
        if (domba.contains(c->box(),assume_disjoint_ba))
        {
            ++cli;
        }
        else
        {
            BoxDomain bxdom;

            amrex::intersect(bxdom, dom, c->box());

            if (bxdom.size() > 0)
            {
                ClusterList clst;
                c->distribute(clst,bxdom);
                lst.splice(lst.end(),clst.lst);
            }
            //
            // Must explicitly delete c.
            //
            delete c;

            lst.erase(cli++);
        }
    }

    domba.clear();
}